

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.c
# Opt level: O1

uint64_t fiobj_str_hash(FIOBJ o)

{
  uint64_t uVar1;
  ulong uVar2;
  size_t len;
  void *data;
  
  if (((uint)o & 7) == 2) {
    uVar2 = o & 0xfffffffffffffff8;
    uVar1 = *(uint64_t *)(uVar2 + 8);
    if (uVar1 == 0) {
      if ((*(byte *)(uVar2 + 0x10) == 0) && (data = *(void **)(uVar2 + 0x38), data != (void *)0x0))
      {
        len = *(size_t *)(uVar2 + 0x28);
      }
      else {
        len = (size_t)(*(byte *)(uVar2 + 0x10) >> 1);
        data = (void *)(uVar2 + 0x12);
      }
      uVar1 = fio_siphash13(data,len,0x120efb,0x12142a);
      *(uint64_t *)(uVar2 + 8) = uVar1;
    }
    return uVar1;
  }
  __assert_fail("FIOBJ_TYPE_IS(o, FIOBJ_T_STRING)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fiobj/fiobj_str.c"
                ,0x145,"uint64_t fiobj_str_hash(FIOBJ)");
}

Assistant:

size_t __attribute__((weak)) fio_ftoa(char *dest, double num, uint8_t base) {
  if (base == 2 || base == 16) {
    /* handle the binary / Hex representation the same as if it were an
     * int64_t
     */
    int64_t *i = (void *)&num;
    return fio_ltoa(dest, *i, base);
  }

  size_t written = sprintf(dest, "%g", num);
  uint8_t need_zero = 1;
  char *start = dest;
  while (*start) {
    if (*start == ',') // locale issues?
      *start = '.';
    if (*start == '.' || *start == 'e') {
      need_zero = 0;
      break;
    }
    start++;
  }
  if (need_zero) {
    dest[written++] = '.';
    dest[written++] = '0';
  }
  return written;
}